

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Accuracy::Texture2DFilteringCase::~Texture2DFilteringCase(Texture2DFilteringCase *this)

{
  Texture2DFilteringCase *this_local;
  
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DFilteringCase_03281740;
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[3])();
  deqp::gls::TextureTestUtil::TextureRenderer::~TextureRenderer(&this->m_renderer);
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::~vector(&this->m_textures);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_filenames);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

Texture2DFilteringCase::~Texture2DFilteringCase (void)
{
	deinit();
}